

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

void hrgls::datablob::DataBlobSourceThread(DataBlobSource_private *info)

{
  StreamCallback p_Var1;
  void *pvVar2;
  double dVar3;
  hrgls_DataBlob blob_00;
  size_type sVar4;
  uint8_t *data_00;
  char *__src;
  rep_conflict rVar5;
  timeval tVar6;
  int local_d4;
  duration<long,_std::ratio<1L,_1000L>_> local_d0;
  lock_guard<std::mutex> local_c8;
  lock_guard<std::mutex> lock_1;
  DataBlob blobpp;
  lock_guard<std::mutex> lock;
  void *callbackUserData;
  StreamCallback callbackHandler;
  uint8_t *data;
  hrgls_DataBlob local_88;
  hrgls_DataBlob blob;
  timeval myTime;
  double interval;
  duration<float,_std::ratio<1L,_1L>_> local_5c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_58;
  duration<float,_std::ratio<1L,_1L>_> dt;
  time_point now;
  value_type_conflict1 local_39;
  ulong local_38;
  size_t i;
  vector<char,_std::allocator<char>_> blobToSend;
  time_point lastBlob;
  DataBlobSource_private *info_local;
  
  if (info != (DataBlobSource_private *)0x0) {
    blobToSend.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::chrono::_V2::system_clock::now();
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&i);
    for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
      local_39 = (value_type_conflict1)local_38;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&i,&local_39);
    }
    do {
      if ((info->running & 1U) != 0) {
        tStack_58.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        interval = (double)std::chrono::operator-
                                     (&stack0xffffffffffffffa8,
                                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&blobToSend.super__Vector_base<char,_std::allocator<char>_>
                                          ._M_impl.field_0x10);
        std::chrono::duration<float,std::ratio<1l,1l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<float,std::ratio<1l,1l>> *)&local_5c,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)&interval);
        dVar3 = StreamProperties::Rate(&info->properties);
        myTime.tv_usec = (__suseconds_t)(1.0 / dVar3);
        tVar6 = API::GetCurrentSystemTime(info->api);
        myTime.tv_sec = tVar6.tv_usec;
        blob = (hrgls_DataBlob)tVar6.tv_sec;
        rVar5 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_5c);
        if ((double)myTime.tv_usec < (double)rVar5) {
          hrgls_DataBlobCreate(&local_88);
          tVar6.tv_usec = myTime.tv_sec;
          tVar6.tv_sec = (__time_t)blob;
          hrgls_DataBlobSetTime(local_88,tVar6);
          sVar4 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&i);
          data_00 = (uint8_t *)operator_new__(sVar4);
          __src = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
          sVar4 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&i);
          memcpy(data_00,__src,sVar4);
          blob_00 = local_88;
          sVar4 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&i);
          hrgls_DataBlobSetData(blob_00,data_00,(uint32_t)sVar4,myDelete,(void *)0x0);
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)&blobpp,&info->callbackMutex);
          p_Var1 = info->callbackHandler;
          pvVar2 = info->callbackUserData;
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&blobpp);
          DataBlob::DataBlob((DataBlob *)&lock_1,local_88);
          hrgls_DataBlobDestroy(local_88);
          if (p_Var1 == (StreamCallback)0x0) {
            std::lock_guard<std::mutex>::lock_guard(&local_c8,&info->storedBlobsMutex);
            std::__cxx11::
            list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::push_back
                      (&info->storedBlobs,(value_type *)&lock_1);
            std::lock_guard<std::mutex>::~lock_guard(&local_c8);
          }
          else {
            (*p_Var1)((DataBlob *)&lock_1,pvVar2);
          }
          DataBlob::~DataBlob((DataBlob *)&lock_1);
        }
      }
      local_d4 = 1;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_d0,&local_d4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_d0);
    } while (((info->quitThread ^ 0xffU) & 1) != 0);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
  }
  return;
}

Assistant:

static void DataBlobSourceThread(DataBlobSource::DataBlobSource_private *info)
    {
      if (!info) { return; }

      // Keeps track of how long since we sent a blob
      auto lastBlob = std::chrono::system_clock::now();

      // Make the data we're going to send.
      std::vector<char> blobToSend;
      for (size_t i = 0; i < 256; i++) {
        blobToSend.push_back(i % 256);
      }

      do {
        // See if we are streaming.
        if (info->running) {
          // See if it is time to create a new blob.
          auto now = std::chrono::system_clock::now();
          std::chrono::duration<float> dt = now - lastBlob;
          double interval = 1.0 / info->properties.Rate();
          timeval myTime = info->api->GetCurrentSystemTime();
          if (dt.count() > interval) {

            // Create a blob
            hrgls_DataBlob blob;
            hrgls_DataBlobCreate(&blob);
            hrgls_DataBlobSetTime(blob, myTime);

            // Copy the DataBlob data, make a copy, and set the deleter function for it.
            uint8_t *data = new uint8_t[blobToSend.size()];
            memcpy(data, blobToSend.data(), blobToSend.size());
            hrgls_DataBlobSetData(blob, data, static_cast<uint32_t>(blobToSend.size()),
              myDelete, nullptr);

            // Need to guard the access to the callback handler and userdata with a
            // mutex so that we don't get half of the information due to a race with the
            // main thread.
            StreamCallback callbackHandler;
            void *callbackUserData;
            {
              std::lock_guard<std::mutex> lock(info->callbackMutex);
              callbackHandler = info->callbackHandler;
              callbackUserData = info->callbackUserData;
            }

            // If we have a callback handler, call it.  If not, queue the DataBlob
            // for later delivery.
            DataBlob blobpp(blob);
            hrgls_DataBlobDestroy(blob);
            if (callbackHandler) {
              callbackHandler(blobpp, callbackUserData);
            } else {
              // Store a blob with a copy of the data onto the front of the queue for
              // GetNextBlob.
              std::lock_guard<std::mutex> lock(info->storedBlobsMutex);
              info->storedBlobs.push_back(blobpp);
            }
          } // if time for a new blob

        } // if running

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
      } while (!info->quitThread);
    }